

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall cmCustomCommandGenerator::FillEmulatorsWithArguments(cmCustomCommandGenerator *this)

{
  cmMakefile *this_00;
  pointer pcVar1;
  bool bVar2;
  TargetType TVar3;
  cmake *cmakeInstance;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  *p_Var4;
  cmGeneratorTarget *this_01;
  cmValue cVar5;
  string *psVar6;
  ulong uVar7;
  long lVar8;
  string_view value;
  undefined1 local_c8 [8];
  undefined1 local_c0 [32];
  string emulator;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_78;
  cmGeneratorExpression ge;
  string local_50 [32];
  
  this_00 = this->LG->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emulator,"CMAKE_CROSSCOMPILING",(allocator<char> *)local_c0);
  bVar2 = cmMakefile::IsOn(this_00,&emulator);
  std::__cxx11::string::~string((string *)&emulator);
  if (bVar2) {
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this->LG);
    p_Var4 = (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              *)cmCustomCommand::GetBacktrace(this->CC);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_78,p_Var4);
    cmGeneratorExpression::cmGeneratorExpression(&ge,cmakeInstance,(cmListFileBacktrace *)&local_78)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    lVar8 = 0;
    uVar7 = 0;
    while( true ) {
      pcVar1 = (this->CommandLines).
               super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
               super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((((long)(this->CommandLines).
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pcVar1) / 0x18 & 0xffffffffU) <=
          uVar7) break;
      this_01 = cmLocalGenerator::FindGeneratorTargetToUse
                          (this->LG,*(string **)
                                     ((long)&(pcVar1->
                                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + lVar8));
      if (this_01 != (cmGeneratorTarget *)0x0) {
        TVar3 = cmGeneratorTarget::GetType(this_01);
        if (TVar3 == EXECUTABLE) {
          bVar2 = cmGeneratorTarget::IsImported(this_01);
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&emulator,"CROSSCOMPILING_EMULATOR",(allocator<char> *)local_c0);
            cVar5 = cmGeneratorTarget::GetProperty(this_01,&emulator);
            std::__cxx11::string::~string((string *)&emulator);
            if (cVar5.Value != (string *)0x0) {
              std::__cxx11::string::string(local_50,(string *)cVar5.Value);
              cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,(string *)&ge);
              local_c0._0_8_ = local_c0 + 0x10;
              local_c0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_c0[0x10] = '\0';
              psVar6 = cmCompiledGeneratorExpression::Evaluate
                                 ((cmCompiledGeneratorExpression *)local_c8,this->LG,
                                  &this->CommandConfig,(cmGeneratorTarget *)0x0,
                                  (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                                  (string *)local_c0);
              std::__cxx11::string::string((string *)&emulator,(string *)psVar6);
              std::__cxx11::string::~string((string *)local_c0);
              std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)local_c8);
              std::__cxx11::string::~string(local_50);
              value._M_str = emulator._M_dataplus._M_p;
              value._M_len = emulator._M_string_length;
              cmList::append((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&(((this->EmulatorsWithArguments).
                                          super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data + lVar8),value,No);
              std::__cxx11::string::~string((string *)&emulator);
            }
          }
        }
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x18;
    }
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::FillEmulatorsWithArguments()
{
  if (!this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
    return;
  }
  cmGeneratorExpression ge(*this->LG->GetCMakeInstance(),
                           this->CC->GetBacktrace());

  for (unsigned int c = 0; c < this->GetNumberOfCommands(); ++c) {
    // If the command is the plain name of an executable target,
    // launch it with its emulator.
    std::string const& argv0 = this->CommandLines[c][0];
    cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(argv0);
    if (target && target->GetType() == cmStateEnums::EXECUTABLE &&
        !target->IsImported()) {

      cmValue emulator_property =
        target->GetProperty("CROSSCOMPILING_EMULATOR");
      if (!emulator_property) {
        continue;
      }

      // Plain target names are replaced by GetArgv0Location with the
      // path to the executable artifact in the command config, so
      // evaluate the launcher's location in the command config too.
      std::string const emulator =
        ge.Parse(*emulator_property)->Evaluate(this->LG, this->CommandConfig);
      cmExpandList(emulator, this->EmulatorsWithArguments[c]);
    }
  }
}